

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_>_>
  _Var5;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder> *pPVar6;
  element_type *peVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  char *value_param;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *puVar16;
  ostream *poVar17;
  size_t sVar18;
  const_iterator cVar19;
  uchar *obj_bytes;
  undefined4 extraout_var;
  undefined4 *puVar20;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar21;
  pointer pIVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  bool bVar26;
  string param_name;
  string test_suite_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder> *local_340;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  element_type *local_330;
  char *local_328;
  string local_320;
  size_t local_300;
  char *local_2f8;
  undefined8 local_2f0;
  char local_2e8 [16];
  long *local_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d0;
  pointer local_2c8;
  pointer local_2c0;
  ParamNameGeneratorFunc *local_2b8;
  TypeId local_2b0;
  char *local_2a8;
  CodeLocation local_2a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_278 [8];
  _Rb_tree_node_base local_270;
  undefined8 local_250;
  char *local_248;
  char local_238 [16];
  string local_228;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  CodeLocation local_1e0;
  ostream *local_1b8 [2];
  ostream local_1a8 [8];
  int32_t aiStack_1a0 [2];
  _Head_base<0UL,_const_libaom_test::CodecFactory_*,_false> local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  psVar21 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_340 = this;
  if (psVar21 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar11 = false;
    do {
      local_330 = (psVar21->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_338 = (psVar21->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi;
      if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_338->_M_use_count = local_338->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_338->_M_use_count = local_338->_M_use_count + 1;
        }
      }
      pIVar22 = (local_340->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2c8 = psVar21;
      while (pIVar22 !=
             (local_340->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        (*pIVar22->generator)(&local_2d8);
        local_2b8 = pIVar22->name_func;
        pcVar2 = pIVar22->file;
        iVar13 = pIVar22->line;
        local_2f8 = local_2e8;
        local_2f0 = 0;
        local_2e8[0] = '\0';
        sVar3 = (pIVar22->name)._M_string_length;
        if (sVar3 != 0) {
          local_1b8[0] = local_1a8;
          pcVar4 = (pIVar22->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar4,pcVar4 + sVar3);
          std::__cxx11::string::append((char *)local_1b8);
          std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0]);
          }
        }
        local_2c0 = pIVar22;
        std::__cxx11::string::_M_append
                  ((char *)&local_2f8,(ulong)(local_330->test_suite_base_name)._M_dataplus._M_p);
        local_270._M_color = _S_red;
        local_270._M_parent = (_Base_ptr)0x0;
        local_270._M_left = &local_270;
        local_250 = 0;
        local_270._M_right = local_270._M_left;
        plVar14 = (long *)(**(code **)(*local_2d8 + 0x10))();
        local_300 = 0;
        local_328 = pcVar2;
        while( true ) {
          plVar15 = (long *)(**(code **)(*local_2d8 + 0x18))();
          if (plVar14 == plVar15) {
            bVar10 = 0;
          }
          else {
            bVar10 = (**(code **)(*plVar14 + 0x30))(plVar14,plVar15);
            bVar10 = bVar10 ^ 1;
          }
          if (plVar15 != (long *)0x0) {
            (**(code **)(*plVar15 + 8))(plVar15);
          }
          if (bVar10 == 0) break;
          Message::Message((Message *)&local_348);
          puVar16 = (undefined8 *)(**(code **)(*plVar14 + 0x28))();
          local_198._M_head_impl = (CodecFactory *)puVar16[4];
          local_1b8[0] = (ostream *)*puVar16;
          local_1b8[1] = (ostream *)puVar16[1];
          local_1a8 = (ostream  [8])puVar16[2];
          aiStack_1a0 = *(int32_t (*) [2])(puVar16 + 3);
          local_190 = local_300;
          (*local_2b8)(&local_320,
                       (TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                        *)local_1b8);
          _Var9._M_p = local_320._M_dataplus._M_p;
          if (local_320._M_string_length == 0) {
            bVar11 = false;
          }
          else {
            lVar23 = local_320._M_string_length - 1;
            lVar25 = 0;
            do {
              uVar24 = (uint)(byte)_Var9._M_p[lVar25];
              iVar12 = isalnum(uVar24);
              bVar11 = iVar12 != 0 || uVar24 == 0x5f;
              if (iVar12 == 0 && uVar24 != 0x5f) break;
              bVar26 = lVar23 != lVar25;
              lVar25 = lVar25 + 1;
            } while (bVar26);
          }
          bVar11 = IsTrue(bVar11);
          pcVar2 = local_328;
          if (!bVar11) {
            GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                               ,0x246);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",0x2f)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_320._M_dataplus._M_p,
                                 local_320._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\' is invalid, in ",0x11);
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
            }
            else {
              sVar18 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar2,sVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
            plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
            std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
            std::ostream::put((char)plVar15);
            std::ostream::flush();
            GTestLog::~GTestLog((GTestLog *)local_1b8);
          }
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_278,&local_320);
          bVar11 = IsTrue(cVar19._M_node == &local_270);
          if (!bVar11) {
            GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                               ,0x24a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_320._M_dataplus._M_p,
                                 local_320._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\', in ",6);
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
            }
            else {
              sVar18 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar2,sVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
            plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
            std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
            std::ostream::put((char)plVar15);
            std::ostream::flush();
            GTestLog::~GTestLog((GTestLog *)local_1b8);
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_278,&local_320);
          sVar3 = (local_330->test_base_name)._M_string_length;
          if (sVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_348._M_head_impl + 0x10),
                       (local_330->test_base_name)._M_dataplus._M_p,sVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_348._M_head_impl + 0x10),"/",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_348._M_head_impl + 0x10),local_320._M_dataplus._M_p,
                     local_320._M_string_length);
          pcVar2 = local_2f8;
          Message::GetString_abi_cxx11_(&local_228,(Message *)&local_348);
          _Var9._M_p = local_228._M_dataplus._M_p;
          obj_bytes = (uchar *)(**(code **)(*plVar14 + 0x28))();
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
          PointerPrinter::PrintValue<libaom_test::CodecFactory_const>
                    (*(CodecFactory **)(obj_bytes + 0x20),local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          PrintBytesInObjectTo(obj_bytes,0x20,local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
          std::__cxx11::stringbuf::str();
          local_2a8 = _Var9._M_p;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          value_param = local_248;
          peVar7 = local_330;
          local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
          pcVar4 = (local_330->code_location).file._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a0,pcVar4,
                     pcVar4 + (local_330->code_location).file._M_string_length);
          local_2a0.line = (peVar7->code_location).line;
          iVar12 = (*(local_340->super_ParameterizedTestSuiteInfoBase).
                     _vptr_ParameterizedTestSuiteInfoBase[3])();
          local_2b0 = (TypeId)CONCAT44(extraout_var,iVar12);
          bVar11 = IsTrue(true);
          if (!bVar11) {
            GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                               ,0x20e);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                       0x32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                       ,0x6a);
            pcVar8 = local_328;
            if (local_328 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
            }
            else {
              sVar18 = strlen(local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar8,sVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
            std::ostream::operator<<(&std::cerr,iVar13);
            GTestLog::~GTestLog((GTestLog *)local_1b8);
          }
          bVar11 = IsTrue(true);
          if (!bVar11) {
            GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                               ,0x223);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                       0x32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                       ,0x6f);
            pcVar8 = local_328;
            if (local_328 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
            }
            else {
              sVar18 = strlen(local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar8,sVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
            std::ostream::operator<<(&std::cerr,iVar13);
            GTestLog::~GTestLog((GTestLog *)local_1b8);
          }
          _Var5.
          super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_false>
          ._M_head_impl =
               (peVar7->test_meta_factory)._M_t.
               super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_>_>
               .
               super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_false>
          ;
          puVar20 = (undefined4 *)(**(code **)(*plVar14 + 0x28))();
          local_1e8 = *(undefined8 *)(puVar20 + 8);
          local_208 = *puVar20;
          uStack_204 = puVar20[1];
          uStack_200 = puVar20[2];
          uStack_1fc = puVar20[3];
          local_1f8 = puVar20[4];
          uStack_1f4 = puVar20[5];
          uStack_1f0 = puVar20[6];
          uStack_1ec = puVar20[7];
          factory = (TestFactoryBase *)
                    (**(code **)(*(long *)_Var5.
                                          super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_false>
                                          ._M_head_impl + 0x10))
                              (_Var5.
                               super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_*,_false>
                               ._M_head_impl,&local_208);
          MakeAndRegisterTestInfo
                    (pcVar2,local_2a8,(char *)0x0,value_param,&local_2a0,local_2b0,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
            operator_delete(local_2a0.file._M_dataplus._M_p);
          }
          if (local_248 != local_238) {
            operator_delete(local_248);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p);
          }
          if (local_348._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_348._M_head_impl + 8))();
          }
          (**(code **)(*plVar14 + 0x18))();
          local_300 = local_300 + 1;
          bVar11 = true;
        }
        if (plVar14 != (long *)0x0) {
          (**(code **)(*plVar14 + 8))();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_278);
        if (local_2f8 != local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_2d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d0);
        }
        pIVar22 = local_2c0 + 1;
      }
      if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
      }
      psVar21 = local_2c8 + 1;
    } while (psVar21 !=
             (local_340->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar11) {
      return;
    }
  }
  pPVar6 = local_340;
  iVar13 = (*(local_340->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_340);
  paVar1 = &local_1e0.file.field_2;
  pcVar4 = (pPVar6->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar4,pcVar4 + (pPVar6->code_location_).file._M_string_length);
  local_1e0.line = (pPVar6->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar13),&local_1e0,
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }